

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testpixmap.cpp
# Opt level: O0

void print_RGB_image(uchar *storage,char *name,int width,int height,bool top_first)

{
  ostream *poVar1;
  int local_30;
  int local_2c;
  int index;
  int col;
  int row;
  bool top_first_local;
  int height_local;
  int width_local;
  char *name_local;
  uchar *storage_local;
  
  local_30 = 0;
  if (top_first) {
    poVar1 = std::operator<<((ostream *)&std::cout,"RGB for ");
    poVar1 = std::operator<<(poVar1,name);
    poVar1 = std::operator<<(poVar1," first row first");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    for (index = 0; index < height; index = index + 1) {
      poVar1 = std::operator<<((ostream *)&std::cout,"Row ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,index);
      std::operator<<(poVar1,":");
      for (local_2c = 0; local_2c < width; local_2c = local_2c + 1) {
        if ((local_2c / 5) * 5 == local_2c) {
          std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
        }
        poVar1 = std::operator<<((ostream *)&std::cout," (");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)storage[local_30]);
        poVar1 = std::operator<<(poVar1,",");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)storage[local_30 + 1]);
        poVar1 = std::operator<<(poVar1,",");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)storage[local_30 + 2]);
        std::operator<<(poVar1,")");
        local_30 = local_30 + 3;
      }
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"RGB for ");
    poVar1 = std::operator<<(poVar1,name);
    poVar1 = std::operator<<(poVar1," last row first");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    for (index = height + -1; -1 < index; index = index + -1) {
      poVar1 = std::operator<<((ostream *)&std::cout,"Row ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,index);
      std::operator<<(poVar1,":");
      for (local_2c = 0; local_2c < width; local_2c = local_2c + 1) {
        if ((local_2c / 5) * 5 == local_2c) {
          std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
        }
        poVar1 = std::operator<<((ostream *)&std::cout," (");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)storage[local_30]);
        poVar1 = std::operator<<(poVar1,",");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)storage[local_30 + 1]);
        poVar1 = std::operator<<(poVar1,",");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)storage[local_30 + 2]);
        std::operator<<(poVar1,")");
        local_30 = local_30 + 3;
      }
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void
print_RGB_image(unsigned const char *storage, const char *name, int width,
                int height, bool top_first)
{
  int row, col, index = 0;
  if (top_first) {
    cout << "RGB for " << name << " first row first" << endl;
    for (row = 0; row < height; row++) {
      cout << "Row " << row << ":";
      for (col = 0; col < width; col++) {
        if ((col / 5) * 5 == col)
          cout << endl;
        cout << " (" << (int)storage[index] << "," << (int)storage[index + 1]
             << "," << (int)storage[index + 2] << ")";
        index += 3;
      }
      cout << endl;
    }
  } else {
    cout << "RGB for " << name << " last row first" << endl;
    for (row = height - 1; row >= 0; row--) {
      cout << "Row " << row << ":";
      for (col = 0; col < width; col++) {
        if ((col / 5) * 5 == col)
          cout << endl;
        cout << " (" << (int)storage[index] << "," << (int)storage[index + 1]
             << "," << (int)storage[index + 2] << ")";
        index += 3;
      }
      cout << endl;
    }
  }
}